

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_selector.hpp
# Opt level: O0

string * __thiscall
jsoncons::jsonpath::detail::
function_selector<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>&>
::to_string_abi_cxx11_
          (function_selector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
           *this,int level)

{
  int in_EDX;
  string *in_RDI;
  int unaff_retaddr;
  token_evaluator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_&>
  *in_stack_00000008;
  string *s;
  string local_48 [51];
  undefined1 local_15;
  int local_14;
  
  local_15 = 0;
  local_14 = in_EDX;
  std::__cxx11::string::string((string *)in_RDI);
  if (0 < local_14) {
    std::__cxx11::string::append((char *)in_RDI);
    std::__cxx11::string::append((ulong)in_RDI,(char)local_14 * '\x02');
  }
  std::__cxx11::string::append((char *)in_RDI);
  token_evaluator<jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>,jsoncons::basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>&>
  ::to_string_abi_cxx11_(in_stack_00000008,unaff_retaddr);
  std::__cxx11::string::append((string *)in_RDI);
  std::__cxx11::string::~string(local_48);
  return in_RDI;
}

Assistant:

std::string to_string(int level) const override
        {
            std::string s;
            if (level > 0)
            {
                s.append("\n");
                s.append(std::size_t(level)*2, ' ');
            }
            s.append("function_selector ");
            s.append(expr_.to_string(level+1));

            return s;
        }